

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void hermite_gk24_set(int n,double *x,double *w)

{
  if (n < 9) {
    if (n == 1) {
      *x = 0.0;
      *w = 1.7724538509055159;
    }
    else {
      if (n != 3) {
LAB_001e019b:
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"HERMITE_GK24_SET - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  Illegal input value of N.\n");
        std::operator<<((ostream *)&std::cerr,"  N must be 1, 3, 9, 19, or 43.\n");
        exit(1);
      }
      *x = -1.224744871391589;
      x[1] = 0.0;
      x[2] = 1.224744871391589;
      *w = 0.2954089751509193;
      w[1] = 1.1816359006036772;
      w[2] = 0.2954089751509193;
    }
  }
  else if (n == 9) {
    *x = -2.959210779063838;
    x[1] = -2.0232301911005157;
    x[2] = -1.224744871391589;
    x[3] = -0.5240335474869576;
    x[4] = 0.0;
    x[5] = 0.5240335474869576;
    x[6] = 1.224744871391589;
    x[7] = 2.0232301911005157;
    x[8] = 2.959210779063838;
    *w = 0.00016708826306882348;
    w[1] = 0.014173117873979098;
    w[2] = 0.16811892894767771;
    w[3] = 0.47869428549114124;
    w[4] = 0.45014700975378197;
    w[5] = 0.47869428549114124;
    w[6] = 0.16811892894767771;
    w[7] = 0.014173117873979098;
    w[8] = 0.00016708826306882348;
  }
  else if (n == 0x13) {
    *x = -4.499599398310388;
    x[1] = -3.667774215946338;
    x[2] = -2.959210779063838;
    x[3] = -2.2665132620567876;
    x[4] = -2.0232301911005157;
    x[5] = -1.8357079751751868;
    x[6] = -1.224744871391589;
    x[7] = -0.8700408953529029;
    x[8] = -0.5240335474869576;
    x[9] = 0.0;
    x[10] = 0.5240335474869576;
    x[0xb] = 0.8700408953529029;
    x[0xc] = 1.224744871391589;
    x[0xd] = 1.8357079751751868;
    x[0xe] = 2.0232301911005157;
    x[0xf] = 2.2665132620567876;
    x[0x10] = 2.959210779063838;
    x[0x11] = 3.667774215946338;
    x[0x12] = 4.499599398310388;
    *w = 1.5295717705322357e-09;
    w[1] = 1.0802767206624762e-06;
    w[2] = 0.00010656589772852267;
    w[3] = 0.0051133174390883855;
    w[4] = -0.011232438489069229;
    w[5] = 0.03205524309944588;
    w[6] = 0.11360729895748269;
    w[7] = 0.10838861955003017;
    w[8] = 0.3692464336892085;
    w[9] = 0.5378816070051017;
    w[10] = 0.3692464336892085;
    w[0xb] = 0.10838861955003017;
    w[0xc] = 0.11360729895748269;
    w[0xd] = 0.03205524309944588;
    w[0xe] = -0.011232438489069229;
    w[0xf] = 0.0051133174390883855;
    w[0x10] = 0.00010656589772852267;
    w[0x11] = 1.0802767206624762e-06;
    w[0x12] = 1.5295717705322357e-09;
  }
  else {
    if (n != 0x2b) goto LAB_001e019b;
    *x = -10.167574994881873;
    x[1] = -7.231746029072501;
    x[2] = -6.535398426382995;
    x[3] = -5.954781975039809;
    x[4] = -5.434053000365068;
    x[5] = -4.952329763008589;
    x[6] = -4.499599398310388;
    x[7] = -4.071335874253583;
    x[8] = -3.667774215946338;
    x[9] = -3.295265921534226;
    x[10] = -2.959210779063838;
    x[0xb] = -2.633356763661946;
    x[0xc] = -2.2665132620567876;
    x[0xd] = -2.089340389294661;
    x[0xe] = -2.0232301911005157;
    x[0xf] = -1.8357079751751868;
    x[0x10] = -1.583643465293944;
    x[0x11] = -1.224744871391589;
    x[0x12] = -0.8700408953529029;
    x[0x13] = -0.5240335474869576;
    x[0x14] = -0.196029453662011;
    x[0x15] = 0.0;
    x[0x16] = 0.196029453662011;
    x[0x17] = 0.5240335474869576;
    x[0x18] = 0.8700408953529029;
    x[0x19] = 1.224744871391589;
    x[0x1a] = 1.583643465293944;
    x[0x1b] = 1.8357079751751868;
    x[0x1c] = 2.0232301911005157;
    x[0x1d] = 2.089340389294661;
    x[0x1e] = 2.2665132620567876;
    x[0x1f] = 2.633356763661946;
    x[0x20] = 2.959210779063838;
    x[0x21] = 3.295265921534226;
    x[0x22] = 3.667774215946338;
    x[0x23] = 4.071335874253583;
    x[0x24] = 4.499599398310388;
    x[0x25] = 4.952329763008589;
    x[0x26] = 5.434053000365068;
    x[0x27] = 5.954781975039809;
    x[0x28] = 6.535398426382995;
    x[0x29] = 7.231746029072501;
    x[0x2a] = 10.167574994881873;
    *w = 5.461919474783181e-38;
    w[1] = 8.754490987132388e-24;
    w[2] = 9.92619971560149e-20;
    w[3] = 1.2261961494786436e-16;
    w[4] = 4.21921851448196e-14;
    w[5] = 5.869158852517349e-12;
    w[6] = 4.0003057542577694e-10;
    w[7] = 1.4865364357179645e-08;
    w[8] = 3.1601836322128925e-07;
    w[9] = 3.8388076194739854e-06;
    w[10] = 2.868023180647778e-05;
    w[0xb] = 0.00018478946568835743;
    w[0xc] = 0.0015090933321163884;
    w[0xd] = -0.0038799558623877155;
    w[0xe] = 0.00673547589010133;
    w[0xf] = 0.0013996625229156807;
    w[0x10] = 0.01636168734938324;
    w[0x11] = 0.045061232904186496;
    w[0x12] = 0.09287115844425754;
    w[0x13] = 0.14586329263214734;
    w[0x14] = 0.16488091368743668;
    w[0x15] = 0.05795959861011811;
    w[0x16] = 0.16488091368743668;
    w[0x17] = 0.14586329263214734;
    w[0x18] = 0.09287115844425754;
    w[0x19] = 0.045061232904186496;
    w[0x1a] = 0.01636168734938324;
    w[0x1b] = 0.0013996625229156807;
    w[0x1c] = 0.00673547589010133;
    w[0x1d] = -0.0038799558623877155;
    w[0x1e] = 0.0015090933321163884;
    w[0x1f] = 0.00018478946568835743;
    w[0x20] = 2.868023180647778e-05;
    w[0x21] = 3.8388076194739854e-06;
    w[0x22] = 3.1601836322128925e-07;
    w[0x23] = 1.4865364357179645e-08;
    w[0x24] = 4.0003057542577694e-10;
    w[0x25] = 5.869158852517349e-12;
    w[0x26] = 4.21921851448196e-14;
    w[0x27] = 1.2261961494786436e-16;
    w[0x28] = 9.92619971560149e-20;
    w[0x29] = 8.754490987132388e-24;
    w[0x2a] = 5.461919474783181e-38;
  }
  return;
}

Assistant:

void hermite_gk24_set ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    HERMITE_GK24_SET sets a Hermite Genz-Keister 24 rule.
//
//  Discussion:
//
//    The integral:
//
//      integral ( -oo <= x <= +oo ) f(x) exp ( - x * x ) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//    A nested family of rules for the Hermite integration problem
//    was produced by Genz and Keister.  The structure of the nested
//    family was denoted by 1+2+6+10+16, that is, it comprised rules 
//    of successive orders O = 1, 3, 9, 19, and 43.
//
//    The precisions of these rules are P = 1, 5, 15, 29, and 67.
//
//    Some of the data in this function was kindly supplied directly by
//    Alan Genz on 24 April 2011.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Alan Genz, Bradley Keister,
//    Fully symmetric interpolatory rules for multiple integrals
//    over infinite regions with Gaussian weight,
//    Journal of Computational and Applied Mathematics,
//    Volume 71, 1996, pages 299-309
//
//    Thomas Patterson,
//    The Optimal Addition of Points to Quadrature Formulae,
//    Mathematics of Computation,
//    Volume 22, Number 104, October 1968, pages 847-856.
//
//  Parameters:
//
//    Input, int N, the order.
//    N must be 1, 3, 9 19, or 43.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  if ( n == 1 )
  {
    x[ 0] =   0.0000000000000000E+00;

    w[ 0] =   1.7724538509055159E+00;
  }
  else if ( n == 3 )
  {
    x[ 0] =  -1.2247448713915889E+00;
    x[ 1] =   0.0000000000000000E+00;
    x[ 2] =   1.2247448713915889E+00;

    w[ 0] =   2.9540897515091930E-01;
    w[ 1] =   1.1816359006036772E+00;
    w[ 2] =   2.9540897515091930E-01;
  }
  else if ( n == 9 )
  {
    x[ 0] =  -2.9592107790638380E+00;
    x[ 1] =  -2.0232301911005157E+00;
    x[ 2] =  -1.2247448713915889E+00;
    x[ 3] =  -5.2403354748695763E-01;
    x[ 4] =   0.0000000000000000E+00;
    x[ 5] =   5.2403354748695763E-01;
    x[ 6] =   1.2247448713915889E+00;
    x[ 7] =   2.0232301911005157E+00;
    x[ 8] =   2.9592107790638380E+00;

    w[ 0] =   1.6708826306882348E-04;
    w[ 1] =   1.4173117873979098E-02;
    w[ 2] =   1.6811892894767771E-01;
    w[ 3] =   4.7869428549114124E-01;
    w[ 4] =   4.5014700975378197E-01;
    w[ 5] =   4.7869428549114124E-01;
    w[ 6] =   1.6811892894767771E-01;
    w[ 7] =   1.4173117873979098E-02;
    w[ 8] =   1.6708826306882348E-04;
  }
  else if ( n == 19 )
  {
    x[ 0] =  -4.4995993983103881E+00;
    x[ 1] =  -3.6677742159463378E+00;
    x[ 2] =  -2.9592107790638380E+00;
    x[ 3] =  -2.2665132620567876E+00;
    x[ 4] =  -2.0232301911005157E+00;
    x[ 5] =  -1.8357079751751868E+00;
    x[ 6] =  -1.2247448713915889E+00;
    x[ 7] =  -8.7004089535290285E-01;
    x[ 8] =  -5.2403354748695763E-01;
    x[ 9] =   0.0000000000000000E+00;
    x[10] =   5.2403354748695763E-01;
    x[11] =   8.7004089535290285E-01;
    x[12] =   1.2247448713915889E+00;
    x[13] =   1.8357079751751868E+00;
    x[14] =   2.0232301911005157E+00;
    x[15] =   2.2665132620567876E+00;
    x[16] =   2.9592107790638380E+00;
    x[17] =   3.6677742159463378E+00;
    x[18] =   4.4995993983103881E+00;

    w[ 0] =   1.5295717705322357E-09;
    w[ 1] =   1.0802767206624762E-06;
    w[ 2] =   1.0656589772852267E-04;
    w[ 3] =   5.1133174390883855E-03;
    w[ 4] =  -1.1232438489069229E-02;
    w[ 5] =   3.2055243099445879E-02;
    w[ 6] =   1.1360729895748269E-01;
    w[ 7] =   1.0838861955003017E-01;
    w[ 8] =   3.6924643368920851E-01;
    w[ 9] =   5.3788160700510168E-01;
    w[10] =   3.6924643368920851E-01;
    w[11] =   1.0838861955003017E-01;
    w[12] =   1.1360729895748269E-01;
    w[13] =   3.2055243099445879E-02;
    w[14] =  -1.1232438489069229E-02;
    w[15] =   5.1133174390883855E-03;
    w[16] =   1.0656589772852267E-04;
    w[17] =   1.0802767206624762E-06;
    w[18] =   1.5295717705322357E-09;
  }
  else if ( n == 43 )
  {
    x[ 0] = -10.167574994881873;
    x[ 1] =  -7.231746029072501;
    x[ 2] =  -6.535398426382995;
    x[ 3] =  -5.954781975039809;
    x[ 4] =  -5.434053000365068;
    x[ 5] =  -4.952329763008589;
    x[ 6] =  -4.4995993983103881;
    x[ 7] =  -4.071335874253583;
    x[ 8] =  -3.6677742159463378;
    x[ 9] =  -3.295265921534226;
    x[10] =  -2.9592107790638380;
    x[11] =  -2.633356763661946;
    x[12] =  -2.2665132620567876;
    x[13] =  -2.089340389294661;
    x[14] =  -2.0232301911005157;
    x[15] =  -1.8357079751751868;
    x[16] =  -1.583643465293944;
    x[17] =  -1.2247448713915889;
    x[18] =  -0.87004089535290285;
    x[19] =  -0.52403354748695763;
    x[20] =  -0.196029453662011;
    x[21] =   0.0000000000000000;
    x[22] =   0.196029453662011;
    x[23] =   0.52403354748695763;
    x[24] =   0.87004089535290285;
    x[25] =   1.2247448713915889;
    x[26] =   1.583643465293944;
    x[27] =   1.8357079751751868;
    x[28] =   2.0232301911005157;
    x[29] =   2.089340389294661;
    x[30] =   2.2665132620567876;
    x[31] =   2.633356763661946;
    x[32] =   2.9592107790638380;
    x[33] =   3.295265921534226;
    x[34] =   3.6677742159463378;
    x[35] =   4.071335874253583;
    x[36] =   4.4995993983103881;
    x[37] =   4.952329763008589;
    x[38] =   5.434053000365068;
    x[39] =   5.954781975039809;
    x[40] =   6.535398426382995;
    x[41] =   7.231746029072501;
    x[42] =  10.167574994881873;

    w[ 0] =   0.546191947478318097E-37;
    w[ 1] =   0.87544909871323873E-23;
    w[ 2] =   0.992619971560149097E-19;
    w[ 3] =   0.122619614947864357E-15;
    w[ 4] =   0.421921851448196032E-13;
    w[ 5] =   0.586915885251734856E-11;
    w[ 6] =   0.400030575425776948E-09;
    w[ 7] =   0.148653643571796457E-07;
    w[ 8] =   0.316018363221289247E-06;
    w[ 9] =   0.383880761947398577E-05;
    w[10] =   0.286802318064777813E-04;
    w[11] =   0.184789465688357423E-03;
    w[12] =   0.150909333211638847E-02;
    w[13] = - 0.38799558623877157E-02;
    w[14] =   0.67354758901013295E-02;
    w[15] =   0.139966252291568061E-02;
    w[16] =   0.163616873493832402E-01;
    w[17] =   0.450612329041864976E-01;
    w[18] =   0.928711584442575456E-01;
    w[19] =   0.145863292632147353E+00;
    w[20] =   0.164880913687436689E+00;
    w[21] =   0.579595986101181095E-01;
    w[22] =   0.164880913687436689E+00;
    w[23] =   0.145863292632147353E+00;
    w[24] =   0.928711584442575456E-01;
    w[25] =   0.450612329041864976E-01;
    w[26] =   0.163616873493832402E-01;
    w[27] =   0.139966252291568061E-02;
    w[28] =   0.67354758901013295E-02;
    w[29] = - 0.38799558623877157E-02;
    w[30] =   0.150909333211638847E-02;
    w[31] =   0.184789465688357423E-03;
    w[32] =   0.286802318064777813E-04;
    w[33] =   0.383880761947398577E-05;
    w[34] =   0.316018363221289247E-06;
    w[35] =   0.148653643571796457E-07;
    w[36] =   0.400030575425776948E-09;
    w[37] =   0.586915885251734856E-11;
    w[38] =   0.421921851448196032E-13;
    w[39] =   0.122619614947864357E-15;
    w[40] =   0.992619971560149097E-19;
    w[41] =   0.87544909871323873E-23;
    w[42] =   0.546191947478318097E-37;
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "HERMITE_GK24_SET - Fatal error!\n";
    std::cerr << "  Illegal input value of N.\n";
    std::cerr << "  N must be 1, 3, 9, 19, or 43.\n";
    exit ( 1 );
  }
  return;
}